

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

JObject * __thiscall
pstack::JObject::field<char[8],pstack::ReaderArray<Elf64_Sym,42ul>,pstack::Elf::Section>
          (JObject *this,char (*k) [8],ReaderArray<Elf64_Sym,_42UL> *v,Section *c)

{
  ostream *os;
  undefined1 local_40 [8];
  Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_> field;
  
  local_40 = (undefined1  [8])k;
  field.k = (char (*) [8])v;
  os = std::operator<<(this->os,this->sep);
  field.v = (ReaderArray<Elf64_Sym,_42UL> *)local_40;
  pstack::operator<<(os,(JSON<pstack::Field<char[8],_pstack::ReaderArray<Elf64_Sym,_42UL>_>,_pstack::Elf::Section>
                         *)&field.v);
  this->sep = ", ";
  return this;
}

Assistant:

JObject &field(const K &k, const V&v, const C &c = C()) {
         Field<K,V> field(k, v);
         os << sep << json(field, c);
         sep = ", ";
         return *this;
      }